

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

int * i4row_min(int m,int n,int *a)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar8 = 0;
  uVar4 = 0xffffffffffffffff;
  if (-1 < m) {
    uVar4 = (ulong)(uint)m << 2;
  }
  uVar9 = 0;
  if (0 < m) {
    uVar9 = (ulong)(uint)m;
  }
  piVar2 = (int *)operator_new__(uVar4);
  piVar3 = a + m;
  for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    iVar6 = a[uVar8];
    piVar2[uVar8] = iVar6;
    piVar5 = piVar3;
    for (lVar7 = 1; lVar7 < n; lVar7 = lVar7 + 1) {
      iVar1 = *piVar5;
      if (iVar1 < iVar6) {
        piVar2[uVar8] = iVar1;
        iVar6 = iVar1;
      }
      piVar5 = piVar5 + m;
    }
    piVar3 = piVar3 + 1;
  }
  return piVar2;
}

Assistant:

int *i4row_min ( int m, int n, int a[] )

//****************************************************************************80
//
//  Purpose:
//
//    I4ROW_MIN returns the minimums of an I4ROW.
//
//  Example:
//
//    A =
//      1  2  3
//      2  6  7
//
//    MIN =
//      1
//      2
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns in the array.
//
//    Input, int A[M*N], the array to be examined.
//
//    Output, int I4ROW_AMIN[M], the minimums of the rows.
//
{
  int i;
  int j;
  int *amin;

  amin = new int[m];

  for ( i = 0; i < m; i++ )
  {
    amin[i] = a[i+0*m];
    for ( j = 1; j < n; j++ )
    {
      if ( a[i+j*m] < amin[i] )
      {
        amin[i] = a[i+j*m];
      }
    }
  }

  return amin;
}